

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Time.cpp
# Opt level: O0

void __thiscall
Time::Time::getAsDate
          (Time *this,int *year,int *month,int *dayOfMonth,int *hour,int *min,int *sec,
          int *dayOfWeek)

{
  time_t t;
  tm ekT;
  int *min_local;
  int *hour_local;
  int *dayOfMonth_local;
  int *month_local;
  int *year_local;
  Time *this_local;
  
  ekT.tm_zone = (char *)min;
  memset(&t,0,0x38);
  makeUTCTime((this->timeSinceEpoch).tv_sec,(tm *)&t);
  *year = ekT.tm_mday;
  *month = ekT.tm_hour;
  *dayOfMonth = ekT.tm_min;
  *hour = ekT.tm_sec;
  *(undefined4 *)ekT.tm_zone = t._4_4_;
  *sec = (int)t;
  if (dayOfWeek != (int *)0x0) {
    *dayOfWeek = ekT.tm_mon;
  }
  return;
}

Assistant:

void Time::getAsDate(int & year, int & month, int & dayOfMonth, int & hour, int & min, int & sec, int * dayOfWeek) const
    {
        struct tm ekT = {0};
        time_t t = timeSinceEpoch.tv_sec;
        makeUTCTime(t, ekT);
        year = ekT.tm_year;
        month = ekT.tm_mon;
        dayOfMonth = ekT.tm_mday;
        hour = ekT.tm_hour;
        min = ekT.tm_min;
        sec = ekT.tm_sec;
        if (dayOfWeek) *dayOfWeek = ekT.tm_wday;

    }